

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void anon_unknown.dwarf_17633d::DecompressZip
               (uchar *dst,unsigned_long *uncompressedSize,uchar *src,unsigned_long srcSize)

{
  unsigned_long uVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  value_type *pvVar5;
  long lVar6;
  reference pvVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  allocator_type local_41;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,*uncompressedSize,
             &local_41);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,0);
  iVar2 = mz_uncompress(pvVar3,uncompressedSize,src,srcSize);
  if (iVar2 != 0) {
    __assert_fail("ret == miniz::MZ_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                  ,0x1bd2,
                  "void (anonymous namespace)::DecompressZip(unsigned char *, unsigned long &, const unsigned char *, unsigned long)"
                 );
  }
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,0);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,0);
  uVar1 = *uncompressedSize;
  while (pvVar7 = pvVar3 + 1, pvVar7 < pvVar4 + uVar1) {
    *pvVar7 = *pvVar7 + *pvVar3 + 0x80;
    pvVar3 = pvVar7;
  }
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,0);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,0);
  uVar1 = *uncompressedSize;
  pvVar5 = dst + uVar1;
  lVar6 = 0;
  for (; dst < pvVar5; dst = dst + 2) {
    *dst = pvVar3[lVar6];
    if (pvVar5 <= dst + 1) break;
    dst[1] = pvVar4[lVar6 + (uVar1 + 1 >> 1)];
    lVar6 = lVar6 + 1;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void DecompressZip(unsigned char *dst, unsigned long &uncompressedSize,
                   const unsigned char *src, unsigned long srcSize) {
  std::vector<unsigned char> tmpBuf(uncompressedSize);

  int ret =
      miniz::mz_uncompress(&tmpBuf.at(0), &uncompressedSize, src, srcSize);
  assert(ret == miniz::MZ_OK);
  (void)ret;

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  // Predictor.
  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + uncompressedSize;

    while (t < stop) {
      int d = int(t[-1]) + int(t[0]) - 128;
      t[0] = d;
      ++t;
    }
  }

  // Reorder the pixel data.
  {
    const char *t1 = reinterpret_cast<const char *>(&tmpBuf.at(0));
    const char *t2 = reinterpret_cast<const char *>(&tmpBuf.at(0)) +
                     (uncompressedSize + 1) / 2;
    char *s = reinterpret_cast<char *>(dst);
    char *stop = s + uncompressedSize;

    while (true) {
      if (s < stop)
        *(s++) = *(t1++);
      else
        break;

      if (s < stop)
        *(s++) = *(t2++);
      else
        break;
    }
  }
}